

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input
          (CompilerMSL *this,string *base_ref,string *mbr_name,SPIRVariable *var)

{
  uint32_t uVar1;
  size_t sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  code cVar5;
  uint32_t uVar6;
  SPIRFunction *pSVar7;
  _func_void *p_Var8;
  CompilerMSL *pCVar9;
  CompilerMSL *pCVar10;
  string var_name;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined8 uStack_e0;
  CompilerMSL *local_d8;
  undefined1 local_d0 [12];
  undefined4 uStack_c4;
  undefined8 local_c0;
  uint *local_b8;
  pointer local_b0;
  uint local_a8 [2];
  long *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  undefined1 local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  string *local_58;
  string local_50;
  
  uVar4 = _local_e8;
  local_58 = mbr_name;
  pSVar7 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  uVar6 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_50,this,(ulong)uVar6,7);
  Compiler::set_name((Compiler *)this,(ID)(var->super_IVariant).self.id,&local_50);
  uVar1 = (var->super_IVariant).self.id;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
            (&pSVar7->local_variables,
             (pSVar7->local_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
  sVar2 = (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          buffer_size;
  (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
  [sVar2].id = uVar1;
  (pSVar7->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
  buffer_size = sVar2 + 1;
  uVar1 = (var->super_IVariant).self.id;
  SmallVector<unsigned_int,_8UL>::reserve
            (&this->vars_needing_early_declaration,
             (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size + 1);
  sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar1;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
  cVar5 = (code)Compiler::is_tessellating_triangles((Compiler *)this);
  if (uVar6 == 0xb) {
    uStack_e0 = (CompilerMSL *)local_d0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&uStack_e0,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    pcVar3 = (base_ref->_M_dataplus)._M_p;
    local_c0 = &local_b0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + base_ref->_M_string_length);
    local_a0 = &local_90;
    pcVar3 = (local_58->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,pcVar3 + local_58->_M_string_length);
    local_78._M_unused._M_object = (void *)0x0;
    local_78._M_pod_data[8] = '\0';
    local_78._M_pod_data[9] = '\0';
    local_78._M_pod_data[10] = '\0';
    local_78._M_pod_data[0xb] = '\0';
    local_78._M_pod_data[0xc] = '\0';
    local_78._M_pod_data[0xd] = '\0';
    local_78._M_pod_data[0xe] = '\0';
    local_78._M_pod_data[0xf] = '\0';
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_80 = cVar5;
    p_Var8 = (_func_void *)operator_new(0x70);
    *(CompilerMSL **)p_Var8 = this;
    *(_func_void **)(p_Var8 + 8) = p_Var8 + 0x18;
    if (uStack_e0 == (CompilerMSL *)local_d0) {
      *(undefined4 *)(p_Var8 + 0x18) = local_d0._0_4_;
      *(undefined4 *)(p_Var8 + 0x1c) = local_d0._4_4_;
      *(undefined4 *)(p_Var8 + 0x20) = local_d0._8_4_;
      *(undefined4 *)(p_Var8 + 0x24) = uStack_c4;
    }
    else {
      *(CompilerMSL **)(p_Var8 + 8) = uStack_e0;
      *(undefined8 *)(p_Var8 + 0x18) = local_d0._0_8_;
    }
    *(CompilerMSL **)(p_Var8 + 0x10) = local_d8;
    local_d8 = (CompilerMSL *)0x0;
    local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
    *(_func_void **)(p_Var8 + 0x28) = p_Var8 + 0x38;
    uStack_e0 = (CompilerMSL *)local_d0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var8 + 0x28),local_c0,(long)local_b8 + (long)local_c0);
    *(_func_void **)(p_Var8 + 0x48) = p_Var8 + 0x58;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var8 + 0x48),local_a0,(long)local_98 + (long)local_a0);
    p_Var8[0x68] = local_80;
    pcStack_60 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3618:7)>
                 ::_M_invoke;
    local_68 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3618:7)>
               ::_M_manager;
    local_78._M_unused._M_function_pointer = p_Var8;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar7->fixup_hooks_in,(function<void_()> *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    pCVar9 = (CompilerMSL *)local_d0;
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    pCVar10 = uStack_e0;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
      pCVar10 = uStack_e0;
    }
  }
  else {
    _local_e8 = CONCAT71(stack0xffffffffffffff19,cVar5);
    pCVar9 = (CompilerMSL *)(local_d0 + 8);
    uStack_e0 = this;
    local_d8 = pCVar9;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    pcVar3 = (base_ref->_M_dataplus)._M_p;
    local_b8 = local_a8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,pcVar3 + base_ref->_M_string_length);
    local_98 = &local_88;
    pcVar3 = (local_58->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar3,pcVar3 + local_58->_M_string_length);
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._M_pod_data[8] = '\0';
    local_78._M_pod_data[9] = '\0';
    local_78._M_pod_data[10] = '\0';
    local_78._M_pod_data[0xb] = '\0';
    local_78._M_pod_data[0xc] = '\0';
    local_78._M_pod_data[0xd] = '\0';
    local_78._M_pod_data[0xe] = '\0';
    local_78._M_pod_data[0xf] = '\0';
    p_Var8 = (_func_void *)operator_new(0x70);
    uStack_e4 = SUB84(uVar4,4);
    *(undefined4 *)p_Var8 = local_e8;
    *(undefined4 *)(p_Var8 + 4) = uStack_e4;
    *(undefined4 *)(p_Var8 + 8) = (undefined4)uStack_e0;
    *(undefined4 *)(p_Var8 + 0xc) = uStack_e0._4_4_;
    *(_func_void **)(p_Var8 + 0x10) = p_Var8 + 0x20;
    if (local_d8 == pCVar9) {
      *(undefined4 *)(p_Var8 + 0x20) = local_d0._8_4_;
      *(undefined4 *)(p_Var8 + 0x24) = uStack_c4;
      *(undefined4 *)(p_Var8 + 0x28) = (undefined4)local_c0;
      *(undefined4 *)(p_Var8 + 0x2c) = local_c0._4_4_;
    }
    else {
      *(CompilerMSL **)(p_Var8 + 0x10) = local_d8;
      *(ulong *)(p_Var8 + 0x20) = CONCAT44(uStack_c4,local_d0._8_4_);
    }
    *(undefined8 *)(p_Var8 + 0x18) = local_d0._0_8_;
    local_d0._0_8_ = (_func_int **)0x0;
    local_d0._8_4_ = local_d0._8_4_ & 0xffffff00;
    *(_func_void **)(p_Var8 + 0x30) = p_Var8 + 0x40;
    local_d8 = pCVar9;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var8 + 0x30),local_b8,(long)local_b0 + (long)local_b8);
    *(_func_void **)(p_Var8 + 0x50) = p_Var8 + 0x60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var8 + 0x50),local_98,(long)local_98 + local_90);
    pcStack_60 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3629:39)>
                 ::_M_invoke;
    local_68 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3629:39)>
               ::_M_manager;
    local_78._M_unused._M_function_pointer = p_Var8;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar7->fixup_hooks_in,(function<void_()> *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    pCVar9 = (CompilerMSL *)(local_d0 + 8);
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    pCVar10 = local_d8;
    if (local_b8 != local_a8) {
      operator_delete(local_b8);
      pCVar10 = local_d8;
    }
  }
  if (pCVar10 != pCVar9) {
    operator_delete(pCVar10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input(const std::string &base_ref, const std::string &mbr_name, SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	string var_name = builtin_to_glsl(builtin, StorageClassFunction);
	set_name(var.self, var_name);

	// We need to declare the variable early and at entry-point scope.
	entry_func.add_local_variable(var.self);
	vars_needing_early_declaration.push_back(var.self);
	bool triangles = is_tessellating_triangles();

	if (builtin == BuiltInTessLevelOuter)
	{
		entry_func.fixup_hooks_in.push_back(
		    [=]()
		    {
			    statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
			    statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			    statement(var_name, "[2] = ", base_ref, ".", mbr_name, "[2];");
			    if (!triangles)
				    statement(var_name, "[3] = ", base_ref, ".", mbr_name, "[3];");
		    });
	}
	else
	{
		entry_func.fixup_hooks_in.push_back([=]() {
			if (triangles)
			{
				if (msl_options.raw_buffer_tese_input)
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, ";");
				else
					statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[3];");
			}
			else
			{
				statement(var_name, "[0] = ", base_ref, ".", mbr_name, "[0];");
				statement(var_name, "[1] = ", base_ref, ".", mbr_name, "[1];");
			}
		});
	}
}